

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O0

void GraphTask::add_edge_features(search *sch,task_data *D,size_t n,multi_ex *ec)

{
  char cVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  reference ppeVar6;
  reference puVar7;
  wclass *pwVar8;
  reference pvVar9;
  size_t sVar10;
  reference pbVar11;
  char *pcVar12;
  vector<example_*,_std::allocator<example_*>_> *in_RCX;
  long lVar13;
  size_type in_RDX;
  long in_RSI;
  search *in_RDI;
  int i1;
  int i0;
  string *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vw *all;
  example *edge;
  size_t k_1;
  size_t other_side;
  size_t m_1;
  size_t j_1;
  bool m_in_sink;
  size_t m;
  size_t j;
  bool n_in_sink;
  uint32_t last_pred;
  float pred_total;
  size_t k;
  size_t i;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffee8;
  task_data *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  float fVar14;
  undefined4 in_stack_ffffffffffffff00;
  float fVar15;
  undefined4 in_stack_ffffffffffffff04;
  long local_e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  vw *local_a0;
  value_type local_98;
  ulong local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  byte local_69;
  ulong local_68;
  ulong local_60;
  byte local_51;
  uint local_50;
  float local_4c;
  ulong local_48;
  size_type local_40;
  unsigned_long *local_38;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  reference local_28;
  vector<example_*,_std::allocator<example_*>_> *local_20;
  size_type local_18;
  long local_10;
  search *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RCX,in_RDX);
  *(value_type *)(local_10 + 0x90) = *ppeVar6;
  local_28 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(local_10 + 0x48),local_18);
  local_30._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffee8
                 );
  local_38 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffee8);
  do {
    bVar5 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffee8);
    if (!bVar5) {
      std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_18);
      v_array<unsigned_char>::push_back
                ((v_array<unsigned_char> *)in_stack_fffffffffffffef0,
                 (uchar *)in_stack_fffffffffffffee8);
      ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_18);
      fVar14 = ((*ppeVar6)->super_example_predict).feature_space[0x83].sum_feat_sq;
      ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_18);
      (*ppeVar6)->total_sum_feat_sq = fVar14 + (*ppeVar6)->total_sum_feat_sq;
      std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_18);
      sVar10 = features::size((features *)0x3e0786);
      ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_18);
      (*ppeVar6)->num_features = sVar10 + (*ppeVar6)->num_features;
      local_a0 = Search::search::get_vw_pointer_unsafe(local_8);
      local_a8 = &local_a0->pairs;
      local_b0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(in_stack_fffffffffffffee8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(in_stack_fffffffffffffee8);
      while (bVar5 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffef0,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffee8), bVar5) {
        pbVar11 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_b0);
        pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)pbVar11);
        cVar1 = *pcVar12;
        pcVar12 = (char *)std::__cxx11::string::operator[]((ulong)pbVar11);
        cVar2 = *pcVar12;
        if ((cVar1 == 0x83) || (cVar2 == 0x83)) {
          std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_18);
          in_stack_fffffffffffffee8 =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)features::size((features *)0x3e088d);
          std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_18);
          sVar10 = features::size((features *)0x3e08be);
          in_stack_fffffffffffffef0 = (task_data *)((long)in_stack_fffffffffffffee8 * sVar10);
          ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (local_20,local_18);
          (*ppeVar6)->num_features =
               (long)&in_stack_fffffffffffffef0->num_loops + (*ppeVar6)->num_features;
          ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (local_20,local_18);
          fVar14 = ((*ppeVar6)->super_example_predict).feature_space[(int)cVar1].sum_feat_sq;
          ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (local_20,local_18);
          fVar15 = ((*ppeVar6)->super_example_predict).feature_space[(int)cVar2].sum_feat_sq;
          ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (local_20,local_18);
          (*ppeVar6)->total_sum_feat_sq = fVar14 * fVar15 + (*ppeVar6)->total_sum_feat_sq;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_b0);
      }
      return;
    }
    puVar7 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_30);
    local_40 = *puVar7;
    for (local_48 = 0; local_48 < *(ulong *)(local_10 + 0x10); local_48 = local_48 + 1) {
      *(undefined4 *)(*(long *)(local_10 + 0x98) + local_48 * 4) = 0;
    }
    local_4c = 0.0;
    local_50 = 0;
    if ((*(byte *)(local_10 + 0x18) & 1) == 0) {
      **(float **)(local_10 + 0x98) = **(float **)(local_10 + 0x98) + 1.0;
      local_4c = 1.0;
      local_50 = 0;
    }
    else {
      local_51 = 1;
      if ((*(byte *)(local_10 + 0x1a) & 1) != 0) {
        local_60 = 0;
        while( true ) {
          uVar4 = local_60;
          ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (local_20,local_40);
          sVar10 = v_array<COST_SENSITIVE::wclass>::size
                             ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar6)->l).simple);
          if (sVar10 - 1 <= uVar4) break;
          ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (local_20,local_40);
          pwVar8 = v_array<COST_SENSITIVE::wclass>::operator[]
                             ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar6)->l).simple,local_60);
          local_68 = (ulong)pwVar8->class_index;
          if (local_68 == 0) break;
          if (local_68 - 1 == local_18) {
            local_51 = 0;
            break;
          }
          local_60 = local_60 + 1;
        }
      }
      local_69 = 0;
      local_78 = 0;
      while( true ) {
        uVar4 = local_78;
        ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_40);
        sVar10 = v_array<COST_SENSITIVE::wclass>::size
                           ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar6)->l).simple);
        if (sVar10 <= uVar4) break;
        ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_40);
        pwVar8 = v_array<COST_SENSITIVE::wclass>::operator[]
                           ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar6)->l).simple,local_78);
        uVar4 = local_78;
        local_80 = (ulong)pwVar8->class_index;
        if (local_80 == 0) {
          local_69 = 1;
          local_80 = 0;
        }
        else {
          ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (local_20,local_40);
          sVar10 = v_array<COST_SENSITIVE::wclass>::size
                             ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar6)->l).simple);
          if (uVar4 == sVar10 - 1) {
            local_69 = 1;
          }
          local_80 = local_80 - 1;
          if (local_80 != local_18) {
            if (((*(byte *)(local_10 + 0x1a) & 1) == 0) || ((local_51 & 1) == (local_69 & 1))) {
              local_e8 = 0;
            }
            else {
              local_e8 = *(long *)(local_10 + 8) + 1;
            }
            local_88 = local_e8;
            lVar3 = *(long *)(local_10 + 0x98);
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (local_10 + 0x78),local_80);
            lVar13 = (*pvVar9 - 1) + local_88;
            *(float *)(lVar3 + lVar13 * 4) = *(float *)(lVar3 + lVar13 * 4) + 1.0;
            local_4c = local_4c + 1.0;
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (local_10 + 0x78),local_80);
            local_50 = (int)*pvVar9 + -1 + (int)local_88;
          }
        }
        local_78 = local_78 + 1;
      }
    }
    if ((local_4c != 0.0) || (NAN(local_4c))) {
      for (local_90 = 0; local_90 < *(ulong *)(local_10 + 0x10); local_90 = local_90 + 1) {
        *(float *)(*(long *)(local_10 + 0x98) + local_90 * 4) =
             *(float *)(*(long *)(local_10 + 0x98) + local_90 * 4) / local_4c;
      }
      ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_40);
      local_98 = *ppeVar6;
      if (1.0 < local_4c) {
        Search::search::get_vw_pointer_unsafe(local_8);
        GD::
        foreach_feature<GraphTask::task_data,_unsigned_long,_&GraphTask::add_edge_features_group_fn>
                  ((vw *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (example *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   in_stack_fffffffffffffef0);
      }
      else {
        **(float **)(local_10 + 0x98) = (float)local_50;
        Search::search::get_vw_pointer_unsafe(local_8);
        GD::
        foreach_feature<GraphTask::task_data,_unsigned_long,_&GraphTask::add_edge_features_single_fn>
                  ((vw *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (example *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   in_stack_fffffffffffffef0);
      }
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

void add_edge_features(Search::search& sch, task_data& D, size_t n, multi_ex& ec)
{
  D.cur_node = ec[n];

  for (size_t i : D.adj[n])
  {
    for (size_t k = 0; k < D.numN; k++) D.neighbor_predictions[k] = 0.;

    float pred_total = 0.;
    uint32_t last_pred = 0;
    if (D.use_structure)
    {
      bool n_in_sink = true;
      if (D.directed)
        for (size_t j = 0; j < ec[i]->l.cs.costs.size() - 1; j++)
        {
          size_t m = ec[i]->l.cs.costs[j].class_index;
          if (m == 0)
            break;
          if (m - 1 == n)
          {
            n_in_sink = false;
            break;
          }
        }

      bool m_in_sink = false;
      for (size_t j = 0; j < ec[i]->l.cs.costs.size(); j++)
      {
        size_t m = ec[i]->l.cs.costs[j].class_index;
        if (m == 0)
        {
          m_in_sink = true;
          continue;
        }
        if (j == ec[i]->l.cs.costs.size() - 1)
          m_in_sink = true;
        m--;
        if (m == n)
          continue;
        size_t other_side = (D.directed && (n_in_sink != m_in_sink)) ? (D.K + 1) : 0;
        D.neighbor_predictions[D.pred[m] - 1 + other_side] += 1.;
        pred_total += 1.;
        last_pred = (uint32_t)D.pred[m] - 1 + (uint32_t)other_side;
      }
    }
    else
    {
      D.neighbor_predictions[0] += 1.;
      pred_total += 1.;
      last_pred = 0;
    }

    if (pred_total == 0.)
      continue;
    // cerr << n << ':' << i << " -> ["; for (size_t k=0; k<D.numN; k++) cerr << ' ' << D.neighbor_predictions[k]; cerr
    // << " ]" << endl;
    for (size_t k = 0; k < D.numN; k++) D.neighbor_predictions[k] /= pred_total;
    example& edge = *ec[i];

    if (pred_total <= 1.)  // single edge
    {
      D.neighbor_predictions[0] = (float)last_pred;
      GD::foreach_feature<task_data, uint64_t, add_edge_features_single_fn>(sch.get_vw_pointer_unsafe(), edge, D);
    }
    else  // lots of edges
      GD::foreach_feature<task_data, uint64_t, add_edge_features_group_fn>(sch.get_vw_pointer_unsafe(), edge, D);
  }
  ec[n]->indices.push_back(neighbor_namespace);
  ec[n]->total_sum_feat_sq += ec[n]->feature_space[neighbor_namespace].sum_feat_sq;
  ec[n]->num_features += ec[n]->feature_space[neighbor_namespace].size();

  vw& all = sch.get_vw_pointer_unsafe();
  for (string& i : all.pairs)
  {
    int i0 = (int)i[0];
    int i1 = (int)i[1];
    if ((i0 == (int)neighbor_namespace) || (i1 == (int)neighbor_namespace))
    {
      ec[n]->num_features += ec[n]->feature_space[i0].size() * ec[n]->feature_space[i1].size();
      ec[n]->total_sum_feat_sq += ec[n]->feature_space[i0].sum_feat_sq * ec[n]->feature_space[i1].sum_feat_sq;
    }
  }
}